

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O2

float * Gia_ManGenerateDelayTableFloat(int nIns,int nOuts)

{
  uint uVar1;
  float *pfVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = nOuts * nIns;
  pfVar2 = (float *)malloc((long)(int)uVar1 * 4 + 0xc);
  *pfVar2 = 0.0;
  *(ulong *)(pfVar2 + 1) = CONCAT44((float)nOuts,(float)nIns);
  uVar3 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    pfVar2[uVar3 + 3] = 1.0;
  }
  pfVar2[((int)uVar4 - nIns) + 3] = -1e+09;
  return pfVar2;
}

Assistant:

float * Gia_ManGenerateDelayTableFloat( int nIns, int nOuts )
{
    int i, Total = nIns * nOuts;
    float * pDelayTable = ABC_ALLOC( float, Total + 3 );
    pDelayTable[0] = 0;
    pDelayTable[1] = nIns;
    pDelayTable[2] = nOuts;
    for ( i = 0; i < Total; i++ )
        pDelayTable[i+3] = 1;
    pDelayTable[i+3 - nIns] = -ABC_INFINITY;
    return pDelayTable;
}